

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::ProcessorProperty::ProcessorProperty
          (ProcessorProperty *this,CodeLocation *l,Property prop)

{
  CodeLocation local_20;
  
  local_20.sourceCode.object = (l->sourceCode).object;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  local_20.location.data = (l->location).data;
  Expression::Expression(&this->super_Expression,&local_20);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_20.sourceCode.object);
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__ProcessorProperty_00307118;
  this->property = prop;
  (this->type).category = primitive;
  (this->type).arrayElementCategory = invalid;
  (this->type).isRef = false;
  (this->type).isConstant = false;
  (this->type).primitiveType.type = (uint)(prop - id < 3) * 4 + float64;
  (this->type).boundingSize = 0;
  (this->type).arrayElementBoundingSize = 0;
  (this->type).structure.object = (Structure *)0x0;
  return;
}

Assistant:

ProcessorProperty (CodeLocation l, Property prop)
            : Expression (std::move (l)), property (prop),
              type (getPropertyType (prop))
        {
        }